

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_vcipher_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  int local_3c;
  uint64_t uStack_38;
  int i;
  ppc_avr_t result;
  ppc_avr_t *b_local;
  ppc_avr_t *a_local;
  ppc_avr_t *r_local;
  
  for (local_3c = 3; -1 < local_3c; local_3c = local_3c + -1) {
    *(uint32_t *)((long)&stack0xffffffffffffffc8 + (long)(3 - local_3c) * 4) =
         b->u32[3 - local_3c] ^
         AES_Te0[a->u8[(int)(0xf - (uint)""[local_3c << 2])]] ^
         AES_Te1[a->u8[(int)(0xf - (uint)""[local_3c * 4 + 1])]] ^
         AES_Te2[a->u8[(int)(0xf - (uint)""[local_3c * 4 + 2])]] ^
         AES_Te3[a->u8[(int)(0xf - (uint)""[local_3c * 4 + 3])]];
  }
  r->u64[0] = uStack_38;
  r->u64[1] = result.u64[0];
  return;
}

Assistant:

void helper_vcipher(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{
    ppc_avr_t result;
    int i;

    VECTOR_FOR_INORDER_I(i, u32) {
        result.VsrW(i) = b->VsrW(i) ^
            (AES_Te0[a->VsrB(AES_shifts[4 * i + 0])] ^
             AES_Te1[a->VsrB(AES_shifts[4 * i + 1])] ^
             AES_Te2[a->VsrB(AES_shifts[4 * i + 2])] ^
             AES_Te3[a->VsrB(AES_shifts[4 * i + 3])]);
    }
    *r = result;
}